

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

float __thiscall QVariant::toFloat(QVariant *this,bool *ok)

{
  bool *in_RDI;
  float fVar1;
  Private *unaff_retaddr;
  
  fVar1 = qNumVariantToHelper<float>(unaff_retaddr,in_RDI);
  return fVar1;
}

Assistant:

float QVariant::toFloat(bool *ok) const
{
    return qNumVariantToHelper<float>(d, ok);
}